

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bssrdf.h
# Opt level: O2

optional<pbrt::BSSRDFProbeSegment> * __thiscall
pbrt::TabulatedBSSRDF::SampleSp
          (optional<pbrt::BSSRDFProbeSegment> *__return_storage_ptr__,TabulatedBSSRDF *this,Float u1
          ,Point2f u2)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Float FVar3;
  Float FVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  undefined8 uVar10;
  undefined1 auVar9 [16];
  undefined8 in_XMM1_Qb;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  Point3<float> PVar13;
  Float local_b8;
  float local_a8;
  float fStack_a4;
  float local_98;
  float fStack_94;
  float local_88;
  float fStack_84;
  Frame local_40;
  
  local_b8 = u2.super_Tuple2<pbrt::Point2,_float>.x;
  if (0.25 <= u1) {
    if (0.5 <= u1) {
      Frame::FromZ(&local_40,(Vector3f)(this->ns).super_Tuple3<pbrt::Normal3,_float>);
    }
    else {
      Frame::FromY(&local_40,(Normal3f)(this->ns).super_Tuple3<pbrt::Normal3,_float>);
    }
  }
  else {
    Frame::FromX(&local_40,(Normal3f)(this->ns).super_Tuple3<pbrt::Normal3,_float>);
  }
  FVar3 = SampleSr(this,local_b8);
  if ((0.0 <= FVar3) && (FVar4 = SampleSr(this,0.999), FVar3 < FVar4)) {
    auVar2._8_8_ = in_XMM1_Qb;
    auVar2._0_8_ = u2.super_Tuple2<pbrt::Point2,_float>;
    auVar2 = vmovshdup_avx(auVar2);
    fVar7 = auVar2._0_4_ * 6.2831855;
    fVar5 = FVar4 * FVar4 - FVar3 * FVar3;
    if (fVar5 < 0.0) {
      fVar5 = sqrtf(fVar5);
    }
    else {
      auVar2 = vsqrtss_avx(ZEXT416((uint)fVar5),ZEXT416((uint)fVar5));
      fVar5 = auVar2._0_4_;
    }
    fVar5 = fVar5 + fVar5;
    fVar6 = cosf(fVar7);
    fVar7 = sinf(fVar7);
    local_a8 = local_40.y.super_Tuple3<pbrt::Vector3,_float>.x;
    fStack_a4 = local_40.y.super_Tuple3<pbrt::Vector3,_float>.y;
    local_98 = local_40.x.super_Tuple3<pbrt::Vector3,_float>.x;
    fStack_94 = local_40.x.super_Tuple3<pbrt::Vector3,_float>.y;
    local_40.x.super_Tuple3<pbrt::Vector3,_float>.z =
         FVar3 * (fVar7 * local_40.y.super_Tuple3<pbrt::Vector3,_float>.z +
                 fVar6 * local_40.x.super_Tuple3<pbrt::Vector3,_float>.z);
    auVar8._0_4_ = FVar3 * (fVar6 * local_98 + fVar7 * local_a8);
    auVar8._4_4_ = FVar3 * (fVar6 * fStack_94 + fVar7 * fStack_a4);
    auVar8._8_4_ = FVar3 * (fVar6 * 0.0 + fVar7 * 0.0);
    auVar8._12_4_ = FVar3 * (fVar6 * 0.0 + fVar7 * 0.0);
    uVar10 = auVar8._8_8_;
    local_40.x.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar8);
    PVar13 = Point3<float>::operator+(&this->po,&local_40.x);
    __return_storage_ptr__->set = true;
    local_88 = local_40.z.super_Tuple3<pbrt::Vector3,_float>.x;
    fStack_84 = local_40.z.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar12._0_4_ = fVar5 * local_88;
    auVar12._4_4_ = fVar5 * fStack_84;
    auVar12._8_4_ = fVar5 * 0.0;
    auVar12._12_4_ = fVar5 * 0.0;
    auVar1._8_4_ = 0xbf000000;
    auVar1._0_8_ = 0xbf000000bf000000;
    auVar1._12_4_ = 0xbf000000;
    auVar2 = vmulps_avx512vl(auVar12,auVar1);
    fVar7 = PVar13.super_Tuple3<pbrt::Point3,_float>.z +
            fVar5 * local_40.z.super_Tuple3<pbrt::Vector3,_float>.z * -0.5;
    auVar9._0_4_ = PVar13.super_Tuple3<pbrt::Point3,_float>.x + auVar2._0_4_;
    auVar9._4_4_ = PVar13.super_Tuple3<pbrt::Point3,_float>.y + auVar2._4_4_;
    auVar9._8_4_ = (float)uVar10 + auVar2._8_4_;
    auVar9._12_4_ = (float)((ulong)uVar10 >> 0x20) + auVar2._12_4_;
    auVar11._0_4_ = auVar12._0_4_ + auVar9._0_4_;
    auVar11._4_4_ = auVar12._4_4_ + auVar9._4_4_;
    auVar11._8_4_ = auVar12._8_4_ + auVar9._8_4_;
    auVar11._12_4_ = auVar12._12_4_ + auVar9._12_4_;
    uVar10 = vmovlps_avx(auVar9);
    *(undefined8 *)&__return_storage_ptr__->optionalValue = uVar10;
    *(float *)((long)&__return_storage_ptr__->optionalValue + 8) = fVar7;
    uVar10 = vmovlps_avx(auVar11);
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xc) = uVar10;
    *(float *)((long)&__return_storage_ptr__->optionalValue + 0x14) =
         fVar5 * local_40.z.super_Tuple3<pbrt::Vector3,_float>.z + fVar7;
    return __return_storage_ptr__;
  }
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xc) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x14) = 0;
  *(undefined8 *)&__return_storage_ptr__->optionalValue = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<BSSRDFProbeSegment> SampleSp(Float u1, Point2f u2) const {
        // Choose projection axis for BSSRDF sampling
        Frame f;
        if (u1 < 0.25f)
            f = Frame::FromX(ns);
        else if (u1 < 0.5f)
            f = Frame::FromY(ns);
        else
            f = Frame::FromZ(ns);

        // Sample BSSRDF profile in polar coordinates
        Float r = SampleSr(u2[0]);
        if (r < 0)
            return {};
        Float phi = 2 * Pi * u2[1];

        // Compute BSSRDF profile bounds and intersection height
        Float r_max = SampleSr(0.999f);
        if (r >= r_max)
            return {};
        Float l = 2 * std::sqrt(Sqr(r_max) - Sqr(r));

        // Return BSSRDF sampling ray segment
        Point3f pStart =
            po + r * (f.x * std::cos(phi) + f.y * std::sin(phi)) - l * f.z * 0.5f;
        Point3f pTarget = pStart + l * f.z;
        return BSSRDFProbeSegment{pStart, pTarget};
    }